

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_string_parser.c
# Opt level: O2

int connectionstringparser_splitHostName
              (STRING_HANDLE hostNameString,STRING_HANDLE nameString,STRING_HANDLE suffixString)

{
  int iVar1;
  char *hostName;
  
  if (hostNameString != (STRING_HANDLE)0x0) {
    hostName = STRING_c_str(hostNameString);
    iVar1 = connectionstringparser_splitHostName_from_char(hostName,nameString,suffixString);
    return iVar1;
  }
  return 0xe1;
}

Assistant:

int connectionstringparser_splitHostName(STRING_HANDLE hostNameString, STRING_HANDLE nameString, STRING_HANDLE suffixString)
{
    int result;

    if (hostNameString == NULL)
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_034: [If the hostNameString is NULL, connectionstringparser_splitHostName shall return MU_FAILURE.]*/
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_033: [connectionstringparser_splitHostName shall convert the hostNameString to a connection_string passed in as argument, and call connectionstringparser_splitHostName_from_char.]*/
        result = connectionstringparser_splitHostName_from_char(STRING_c_str(hostNameString), nameString, suffixString);
    }

    return result;
}